

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03.cpp
# Opt level: O1

int main(void)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  char x;
  char eme [8];
  char pinkish [12];
  byte local_29;
  char local_28 [24];
  
  setlocale(6,"");
  builtin_strncpy(local_28,"\x1b[1;36m",8);
  sVar1 = strlen(local_28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_28,sVar1);
  builtin_strncpy(local_28 + 8,"\x1b[38;5;212m",0xc);
  sVar1 = strlen(local_28 + 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_28 + 8,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Para cada alternativa digite: ",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(n) para o rebelde Nietzsche.",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(s) para o realista shopenhauer.",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(k) para o moralista Kant.",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"(h) para o institucionalista Hegel.",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(char *)&local_29);
  if (local_29 < 0x6e) {
    if (local_29 == 0x68) {
      pcVar3 = anon_var_dwarf_9c1;
    }
    else {
      if (local_29 != 0x6b) goto LAB_001013f4;
      pcVar3 = anon_var_dwarf_9ab;
    }
    lVar2 = 0x31;
  }
  else {
    if (local_29 == 0x73) {
      pcVar3 = anon_var_dwarf_995;
      lVar2 = 0x3b;
      goto LAB_00101448;
    }
    if (local_29 == 0x6e) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_969,0x3a);
      pcVar3 = "Uma ponte sob o abismo!!!";
      lVar2 = 0x19;
      goto LAB_00101448;
    }
LAB_001013f4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_9cb,0x2e);
    pcVar3 = anon_var_dwarf_9e1;
    lVar2 = 0x32;
  }
LAB_00101448:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  setlocale(LC_ALL, "");
  char eme[] = {0x1b, '[', '1', ';', '3', '6', 'm', 0};
  cout << eme;

  const char n = 'n';
  const char s = 's';
  const char k = 'k';
  const char h = 'h';
  char x;
  char pinkish[] = { 0x1b, '[', '3', '8',';','5',';','2','1','2','m',0 };
  cout << pinkish;

  cout << "Para cada alternativa digite: " << endl;
  cout << "(n) para o rebelde Nietzsche." << endl;
  cout << "(s) para o realista shopenhauer." << endl;
  cout << "(k) para o moralista Kant." << endl;
  cout << "(h) para o institucionalista Hegel." << endl;
  cin >> x;

  switch (x)
  {
  case (n):
    cout << "O Homem é uma ponte atada entre o animal e o super homem!";
    cout << "Uma ponte sob o abismo!!!" << endl;
    break;

  case (s):
    cout << "A solidão é a sorte de todos os espíritos excepcionais!!" << endl;
    break;

  case (k):
    cout << "Belo, é tudo quanto agrada desinteressadamente!!" << endl;
    break;

  case (h):
    cout << "Nada de grande se realizou no mundo sem paixão!!" << endl;
    break;

  default:
    cout << "Sua opção com certeza foi uma grande figura.";
    cout << "Mas não está cadastrada no sistema. Arriverdeci!" << endl;
    break;
  }
  return 0;
}